

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int png_image_read_and_map(png_voidp argument)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  png_const_structrp png_ptr;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint local_74;
  uint local_70;
  
  puVar3 = *argument;
  png_ptr = *(png_const_structrp *)*puVar3;
  local_74 = 1;
  if (png_ptr->interlaced != '\0') {
    if (png_ptr->interlaced != '\x01') {
      png_error(png_ptr,"unknown interlace type");
    }
    local_74 = 7;
  }
  uVar1 = *(uint *)((long)puVar3 + 0xc);
  uVar2 = *(uint *)(puVar3 + 2);
  lVar4 = *(long *)((long)argument + 0x30);
  lVar5 = *(long *)((long)argument + 0x38);
  uVar10 = 0;
  uVar7 = *(int *)((long)argument + 0x48) - 1;
  do {
    uVar9 = (uint)uVar10;
    if (png_ptr->interlaced == '\x01') {
      bVar8 = 3;
      if (1 < uVar9) {
        bVar8 = (byte)(7 - uVar9 >> 1);
      }
      if ((~(-1 << (bVar8 & 0x1f)) + uVar1) -
          ((uVar9 & 1) << (3U - (char)(uVar9 + 1 >> 1) & 0x1f) & 7) >> (bVar8 & 0x1f) != 0) {
        uVar10 = (ulong)((uVar9 & 1 ^ 1) << (3U - (char)(uVar10 >> 1) & 0x1f) & 7);
        local_70 = 8 >> ((byte)(uVar9 - 1 >> 1) & 0x1f);
        if (uVar9 < 3) {
          local_70 = 8;
        }
        goto LAB_0011239a;
      }
    }
    else {
      local_70 = 1;
      uVar10 = 0;
LAB_0011239a:
      for (; (uint)uVar10 < uVar2; uVar10 = (ulong)((uint)uVar10 + local_70)) {
        png_read_row(png_ptr,*(png_bytep *)((long)argument + 0x28),(png_bytep)0x0);
        if (uVar7 < 4) {
          iVar6 = (*(code *)(&DAT_0012dcec + *(int *)(&DAT_0012dcec + (ulong)uVar7 * 4)))
                            (&DAT_0012dcec,(ulong)uVar1,
                             &DAT_0012dcec + *(int *)(&DAT_0012dcec + (ulong)uVar7 * 4),
                             uVar10 * lVar5 + lVar4 + (ulong)uVar1,0xff,0xfe);
          return iVar6;
        }
      }
    }
    uVar10 = (ulong)(uVar9 + 1);
    if (uVar9 + 1 == local_74) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
png_image_read_and_map(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   /* Called when the libpng data must be transformed into the color-mapped
    * form.  There is a local row buffer in display->local and this routine must
    * do the interlace handling.
    */
   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      int          proc = display->colormap_processing;
      png_bytep    first_row = png_voidcast(png_bytep, display->first_row);
      ptrdiff_t    step_row = display->row_bytes;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass);
            stepx = PNG_PASS_COL_OFFSET(pass);
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow = first_row + y * step_row;
            png_const_bytep end_row = outrow + width;

            /* Read read the libpng data into the temporary buffer. */
            png_read_row(png_ptr, inrow, NULL);

            /* Now process the row according to the processing option, note
             * that the caller verifies that the format of the libpng output
             * data is as required.
             */
            outrow += startx;
            switch (proc)
            {
               case PNG_CMAP_GA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     /* The data is always in the PNG order */
                     unsigned int gray = *inrow++;
                     unsigned int alpha = *inrow++;
                     unsigned int entry;

                     /* NOTE: this code is copied as a comment in
                      * make_ga_colormap above.  Please update the
                      * comment if you change this code!
                      */
                     if (alpha > 229) /* opaque */
                     {
                        entry = (231 * gray + 128) >> 8;
                     }
                     else if (alpha < 26) /* transparent */
                     {
                        entry = 231;
                     }
                     else /* partially opaque */
                     {
                        entry = 226 + 6 * PNG_DIV51(alpha) + PNG_DIV51(gray);
                     }

                     *outrow = (png_byte)entry;
                  }
                  break;

               case PNG_CMAP_TRANS:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     png_byte gray = *inrow++;
                     png_byte alpha = *inrow++;

                     if (alpha == 0)
                        *outrow = PNG_CMAP_TRANS_BACKGROUND;

                     else if (gray != PNG_CMAP_TRANS_BACKGROUND)
                        *outrow = gray;

                     else
                        *outrow = (png_byte)(PNG_CMAP_TRANS_BACKGROUND+1);
                  }
                  break;

               case PNG_CMAP_RGB:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     *outrow = PNG_RGB_INDEX(inrow[0], inrow[1], inrow[2]);
                     inrow += 3;
                  }
                  break;

               case PNG_CMAP_RGB_ALPHA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     unsigned int alpha = inrow[3];

                     /* Because the alpha entries only hold alpha==0.5 values
                      * split the processing at alpha==0.25 (64) and 0.75
                      * (196).
                      */

                     if (alpha >= 196)
                        *outrow = PNG_RGB_INDEX(inrow[0], inrow[1],
                            inrow[2]);

                     else if (alpha < 64)
                        *outrow = PNG_CMAP_RGB_ALPHA_BACKGROUND;

                     else
                     {
                        /* Likewise there are three entries for each of r, g
                         * and b.  We could select the entry by popcount on
                         * the top two bits on those architectures that
                         * support it, this is what the code below does,
                         * crudely.
                         */
                        unsigned int back_i = PNG_CMAP_RGB_ALPHA_BACKGROUND+1;

                        /* Here are how the values map:
                         *
                         * 0x00 .. 0x3f -> 0
                         * 0x40 .. 0xbf -> 1
                         * 0xc0 .. 0xff -> 2
                         *
                         * So, as above with the explicit alpha checks, the
                         * breakpoints are at 64 and 196.
                         */
                        if (inrow[0] & 0x80) back_i += 9; /* red */
                        if (inrow[0] & 0x40) back_i += 9;
                        if (inrow[0] & 0x80) back_i += 3; /* green */
                        if (inrow[0] & 0x40) back_i += 3;
                        if (inrow[0] & 0x80) back_i += 1; /* blue */
                        if (inrow[0] & 0x40) back_i += 1;

                        *outrow = (png_byte)back_i;
                     }

                     inrow += 4;
                  }
                  break;

               default:
                  break;
            }
         }
      }
   }

   return 1;
}